

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-interface.c
# Opt level: O2

int run_test_udp_multicast_interface(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_180;
  sockaddr_in baddr;
  sockaddr_in addr;
  uv_buf_t local_158;
  uv_udp_send_t req;
  
  iVar1 = uv_ip4_addr("239.255.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init(puVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_ip4_addr("0.0.0.0",0,&baddr);
      if (iVar1 == 0) {
        iVar1 = uv_udp_bind(&server,(sockaddr *)&baddr,0);
        if (iVar1 == 0) {
          iVar1 = uv_udp_set_multicast_interface(&server,"0.0.0.0");
          if (iVar1 == 0) {
            local_158 = uv_buf_init("PING",4);
            iVar1 = uv_udp_send(&req,&server,&local_158,1,(sockaddr *)&addr,sv_send_cb);
            if (iVar1 == 0) {
              if (close_cb_called == 0) {
                if (sv_send_cb_called == 0) {
                  puVar2 = uv_default_loop();
                  uv_run(puVar2,UV_RUN_DEFAULT);
                  if (sv_send_cb_called == 1) {
                    if (close_cb_called == 1) {
                      if (server.send_queue_size == 0) {
                        puVar2 = uv_default_loop();
                        uv_walk(puVar2,close_walk_cb,(void *)0x0);
                        uv_run(puVar2,UV_RUN_DEFAULT);
                        puVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(puVar2);
                        if (iVar1 == 0) {
                          return 0;
                        }
                        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                        uStack_180 = 0x61;
                      }
                      else {
                        pcVar3 = "server.send_queue_size == 0";
                        uStack_180 = 0x5f;
                      }
                    }
                    else {
                      pcVar3 = "close_cb_called == 1";
                      uStack_180 = 0x5c;
                    }
                  }
                  else {
                    pcVar3 = "sv_send_cb_called == 1";
                    uStack_180 = 0x5b;
                  }
                }
                else {
                  pcVar3 = "sv_send_cb_called == 0";
                  uStack_180 = 0x56;
                }
              }
              else {
                pcVar3 = "close_cb_called == 0";
                uStack_180 = 0x55;
              }
            }
            else {
              pcVar3 = "r == 0";
              uStack_180 = 0x53;
            }
          }
          else {
            pcVar3 = "r == 0";
            uStack_180 = 0x49;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_180 = 0x46;
        }
      }
      else {
        pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", 0, &baddr)";
        uStack_180 = 0x44;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_180 = 0x42;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"239.255.0.1\", TEST_PORT, &addr)";
    uStack_180 = 0x3f;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-multicast-interface.c"
          ,uStack_180,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(udp_multicast_interface) {
  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in addr;
  struct sockaddr_in baddr;

  ASSERT(0 == uv_ip4_addr("239.255.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("0.0.0.0", 0, &baddr));
  r = uv_udp_bind(&server, (const struct sockaddr*)&baddr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_multicast_interface(&server, "0.0.0.0");
  ASSERT(r == 0);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*)&addr,
                  sv_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(sv_send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}